

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection2.c
# Opt level: O1

void ssh2_connection_reconfigure(PacketProtocolLayer *ppl,Conf *conf)

{
  Conf *conf_00;
  
  conf_free((Conf *)ppl[-2].selfptr);
  conf_00 = conf_copy(conf);
  ppl[-2].selfptr = (PacketProtocolLayer **)conf_00;
  if (*(char *)&ppl[-1].bpp == '\x01') {
    portfwdmgr_config((PortFwdManager *)ppl[-1].vt,conf_00);
    return;
  }
  return;
}

Assistant:

static void ssh2_connection_reconfigure(PacketProtocolLayer *ppl, Conf *conf)
{
    struct ssh2_connection_state *s =
        container_of(ppl, struct ssh2_connection_state, ppl);

    conf_free(s->conf);
    s->conf = conf_copy(conf);

    if (s->portfwdmgr_configured)
        portfwdmgr_config(s->portfwdmgr, s->conf);
}